

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::expand
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this)

{
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar1;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  
  sVar4 = 8;
  if (this->_capacity != 0) {
    sVar4 = this->_capacity * 2;
  }
  uVar6 = sVar4 * 0x20;
  if (uVar6 == 0) {
    pMVar2 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar6 < 0x41) {
    pMVar2 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pMVar2 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)::operator_new(uVar6,0x10);
  }
  if (this->_capacity != 0) {
    uVar6 = this->_capacity;
    if (uVar6 != 0) {
      lVar5 = 0;
      uVar3 = 0;
      do {
        pMVar1 = this->_stack;
        Kernel::IntegerConstantType::IntegerConstantType
                  ((IntegerConstantType *)((long)&(pMVar2->numeral)._val[0]._mp_alloc + lVar5),
                   (IntegerConstantType *)((long)&(pMVar1->numeral)._val[0]._mp_alloc + lVar5));
        *(undefined4 *)
         ((long)&((Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
                   *)(&pMVar2->numeral + 1))->_id + lVar5) =
             *(undefined4 *)
              ((long)&((Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
                        *)(&pMVar1->numeral + 1))->_id + lVar5);
        *(undefined8 *)
         ((long)&((Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
                   *)(&pMVar2->numeral + 1))->_ptr + lVar5) =
             *(undefined8 *)
              ((long)&((Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
                        *)(&pMVar1->numeral + 1))->_ptr + lVar5);
        mpz_clear((__mpz_struct *)((long)&(this->_stack->numeral)._val[0]._mp_alloc + lVar5));
        uVar3 = uVar3 + 1;
        uVar6 = this->_capacity;
        lVar5 = lVar5 + 0x20;
      } while (uVar3 < uVar6);
    }
    pMVar1 = this->_stack;
    if (pMVar1 != (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0) {
      uVar6 = uVar6 * 0x20;
      if (uVar6 == 0) {
        (pMVar1->numeral)._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
        (pMVar1->numeral)._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pMVar1;
      }
      else if (uVar6 < 0x21) {
        (pMVar1->numeral)._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
        (pMVar1->numeral)._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pMVar1;
      }
      else if (uVar6 < 0x31) {
        (pMVar1->numeral)._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
        (pMVar1->numeral)._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pMVar1;
      }
      else if (uVar6 < 0x41) {
        (pMVar1->numeral)._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
        (pMVar1->numeral)._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pMVar1;
      }
      else {
        operator_delete(pMVar1,0x10);
      }
    }
  }
  this->_stack = pMVar2;
  this->_cursor = pMVar2 + this->_capacity;
  this->_end = pMVar2 + sVar4;
  this->_capacity = sVar4;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }